

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

void __thiscall icu_63::OlsonTimeZone::deleteTransitionRules(OlsonTimeZone *this)

{
  int local_14;
  int i;
  OlsonTimeZone *this_local;
  
  if ((this->initialRule != (InitialTimeZoneRule *)0x0) &&
     (this->initialRule != (InitialTimeZoneRule *)0x0)) {
    (*(this->initialRule->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
  }
  if ((this->firstTZTransition != (TimeZoneTransition *)0x0) &&
     (this->firstTZTransition != (TimeZoneTransition *)0x0)) {
    (*(this->firstTZTransition->super_UObject)._vptr_UObject[1])();
  }
  if ((this->firstFinalTZTransition != (TimeZoneTransition *)0x0) &&
     (this->firstFinalTZTransition != (TimeZoneTransition *)0x0)) {
    (*(this->firstFinalTZTransition->super_UObject)._vptr_UObject[1])();
  }
  if ((this->finalZoneWithStartYear != (SimpleTimeZone *)0x0) &&
     (this->finalZoneWithStartYear != (SimpleTimeZone *)0x0)) {
    (*(this->finalZoneWithStartYear->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
      [1])();
  }
  if (this->historicRules != (TimeArrayTimeZoneRule **)0x0) {
    for (local_14 = 0; local_14 < this->historicRuleCount; local_14 = local_14 + 1) {
      if ((this->historicRules[local_14] != (TimeArrayTimeZoneRule *)0x0) &&
         (this->historicRules[local_14] != (TimeArrayTimeZoneRule *)0x0)) {
        (*(this->historicRules[local_14]->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
      }
    }
    uprv_free_63(this->historicRules);
  }
  clearTransitionRules(this);
  return;
}

Assistant:

void
OlsonTimeZone::deleteTransitionRules(void) {
    if (initialRule != NULL) {
        delete initialRule;
    }
    if (firstTZTransition != NULL) {
        delete firstTZTransition;
    }
    if (firstFinalTZTransition != NULL) {
        delete firstFinalTZTransition;
    }
    if (finalZoneWithStartYear != NULL) {
        delete finalZoneWithStartYear;
    }
    if (historicRules != NULL) {
        for (int i = 0; i < historicRuleCount; i++) {
            if (historicRules[i] != NULL) {
                delete historicRules[i];
            }
        }
        uprv_free(historicRules);
    }
    clearTransitionRules();
}